

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void double_create_script_window_proc(Am_Object *cmd)

{
  Am_Value *list_value;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value_List commands_for_script;
  
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_30,(Am_Slot_Flags)&local_28);
  list_value = Am_Object::Get(&local_30,0x169,3);
  Am_Value_List::Am_Value_List(&commands_for_script,list_value);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  internal_start_create_script_window(&commands_for_script,cmd);
  Am_Value_List::~Am_Value_List(&commands_for_script);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, double_create_script_window,
                 (Am_Object cmd))
{
  //cmd is in inter, owner = scroll menu
  Am_Value_List commands_for_script =
      cmd.Get_Object(Am_SAVED_OLD_OWNER)
          .Get_Owner()
          .Get(Am_VALUE, Am_RETURN_ZERO_ON_ERROR);
  internal_start_create_script_window(commands_for_script, cmd);
}